

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_cmp_mag(mp_int *a,mp_int *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = a->used;
  iVar4 = 1;
  if (iVar5 <= b->used) {
    if (iVar5 < b->used) {
LAB_001042be:
      iVar4 = -1;
    }
    else {
      iVar1 = iVar5 + -1;
      lVar6 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      while( true ) {
        if (-iVar5 == (int)lVar6) {
          return 0;
        }
        uVar2 = b->dp[iVar1 + lVar6];
        uVar3 = a->dp[iVar1 + lVar6];
        if (uVar3 >= uVar2 && uVar3 != uVar2) break;
        if (uVar3 < uVar2) goto LAB_001042be;
        lVar6 = lVar6 + -1;
      }
    }
  }
  return iVar4;
}

Assistant:

int mp_cmp_mag (mp_int * a, mp_int * b)
{
  int     n;
  mp_digit *tmpa, *tmpb;

  /* compare based on # of non-zero digits */
  if (a->used > b->used) {
    return MP_GT;
  }
  
  if (a->used < b->used) {
    return MP_LT;
  }

  /* alias for a */
  tmpa = a->dp + (a->used - 1);

  /* alias for b */
  tmpb = b->dp + (a->used - 1);

  /* compare based on digits  */
  for (n = 0; n < a->used; ++n, --tmpa, --tmpb) {
    if (*tmpa > *tmpb) {
      return MP_GT;
    }

    if (*tmpa < *tmpb) {
      return MP_LT;
    }
  }
  return MP_EQ;
}